

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MFP68901.cpp
# Opt level: O2

void __thiscall Motorola::MFP68901::MFP68901::set_timer_event_input<0>(MFP68901 *this,bool value)

{
  if (((this->timers_[0].event_input != value) &&
      (this->timers_[0].event_input = value, this->timers_[0].mode == EventCount)) &&
     (((this->gpip_active_edge_ & 0x10) == 0) != value)) {
    decrement_timer<0>(this,1);
    return;
  }
  return;
}

Assistant:

void MFP68901::set_timer_event_input(bool value) {
	if(timers_[channel].event_input == value) return;

	timers_[channel].event_input = value;
	if(timers_[channel].mode == TimerMode::EventCount && (value == !!(gpip_active_edge_ & (0x10 >> channel)))) {
		// "The active state of the signal on TAI or TBI is dependent upon the associated
		// Interrupt Channel’s edge bit (GPIP 4 for TAI and GPIP 3 for TBI [...] ).
		// If the edge bit associated with the TAI or TBI input is a one, it will be active high.
		decrement_timer<channel>(1);
	}

	// TODO:
	//
	// Altering the edge bit while the timer is in the event count mode can produce a count pulse.
	// The interrupt channel associated with the input (I3 for I4 for TAI) is allowed to function normally.
	// To count transitions reliably, the input must remain in each state (1/O) for a length of time equal
	// to four periods of the timer clock.
	//
	// (the final bit probably explains 13 cycles of the DE to interrupt latency; not sure about the other ~15)
}